

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

Matcher<const_google::protobuf::FileDescriptorProto_&> * __thiscall
testing::internal::
MatcherBaseImpl<upb_test::EqualsProtoTreatNansAsEqualMatcherP<google::protobuf::FileDescriptorProto>>
::Apply<google::protobuf::FileDescriptorProto_const&,0ul>
          (void *__return_storage_ptr__,FileDescriptorProto *this)

{
  gmock_Impl<const_google::protobuf::FileDescriptorProto_&> *this_00;
  FileDescriptorProto local_110;
  
  this_00 = (gmock_Impl<const_google::protobuf::FileDescriptorProto_&> *)operator_new(0x100);
  google::protobuf::FileDescriptorProto::FileDescriptorProto(&local_110,this);
  upb_test::EqualsProtoTreatNansAsEqualMatcherP<google::protobuf::FileDescriptorProto>::
  gmock_Impl<const_google::protobuf::FileDescriptorProto_&>::gmock_Impl(this_00,&local_110);
  Matcher<const_google::protobuf::FileDescriptorProto_&>::Matcher
            ((Matcher<const_google::protobuf::FileDescriptorProto_&> *)__return_storage_ptr__,
             (MatcherInterface<const_google::protobuf::FileDescriptorProto_&> *)this_00);
  google::protobuf::FileDescriptorProto::~FileDescriptorProto(&local_110);
  return (Matcher<const_google::protobuf::FileDescriptorProto_&> *)__return_storage_ptr__;
}

Assistant:

::testing::Matcher<F> Apply(std::index_sequence<tuple_ids...>) const {
    return ::testing::Matcher<F>(
        new typename Derived<Ts...>::template gmock_Impl<F>(
            std::get<tuple_ids>(params_)...));
  }